

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O1

void mpc_sbox_prove_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  uint64_t r1m [3];
  uint64_t r0m [3];
  uint64_t r0s [3];
  uint64_t x2m [3];
  uint64_t x1s [3];
  uint64_t x0s [3];
  uint64_t r2m [3];
  uint64_t r1s [3];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  uint64_t local_48 [3];
  
  auVar2 = vmovdqu64_avx512vl(*(undefined1 (*) [32])in);
  auVar4._0_24_ = auVar2._0_24_;
  auVar4._24_8_ = 0;
  auVar2 = vmovdqu64_avx512vl(*(undefined1 (*) [32])rvec);
  auVar3._0_24_ = auVar2._0_24_;
  auVar3._24_8_ = 0;
  auVar2 = vpsllq_avx2(auVar4,2);
  auVar14._8_8_ = 0x9249249000000000;
  auVar14._0_8_ = 0x9249249000000000;
  auVar14._16_8_ = 0x9249249000000000;
  auVar14._24_8_ = 0x9249249000000000;
  auVar2 = vpand_avx2(auVar2,auVar14);
  local_88 = vmovdqu64_avx512vl(auVar2);
  auVar2 = vpaddq_avx2(auVar4,auVar4);
  auVar2 = vpand_avx2(auVar2,auVar14);
  local_a8 = vmovdqu64_avx512vl(auVar2);
  auVar2 = vpand_avx2(auVar4,auVar14);
  local_c8 = vmovdqu64_avx512vl(auVar2);
  auVar2._8_8_ = 0x2492492400000000;
  auVar2._0_8_ = 0x2492492400000000;
  auVar2._16_8_ = 0x2492492400000000;
  auVar2._24_8_ = 0x2492492400000000;
  auVar4 = vpandq_avx512vl(auVar3,auVar2);
  vmovdqu64_avx512vl(auVar4);
  auVar5._8_8_ = 0x4924924800000000;
  auVar5._0_8_ = 0x4924924800000000;
  auVar5._16_8_ = 0x4924924800000000;
  auVar5._24_8_ = 0x4924924800000000;
  auVar5 = vpandq_avx512vl(auVar3,auVar5);
  local_128 = vmovdqu64_avx512vl(auVar5);
  auVar2 = vpand_avx2(auVar3,auVar14);
  local_68 = vmovdqu64_avx512vl(auVar2);
  auVar2 = vpsllq_avx2(auVar4,2);
  local_e8 = vmovdqu64_avx512vl(auVar2);
  auVar2 = vpaddq_avx2(auVar5,auVar5);
  _local_48 = vmovdqu64_avx512vl(auVar2);
  auVar2 = vmovdqu64_avx512vl(local_a8);
  auVar6._0_24_ = auVar2._0_24_;
  auVar6._24_8_ = 0;
  vpmovsxbq_avx(ZEXT216(0x201));
  auVar2 = vpgatherqq_avx512vl(*(uint64_t *)((long)local_a8 + local_48 * 8));
  auVar7._0_24_ = auVar2._0_24_;
  auVar7._24_8_ = 0;
  auVar2 = vpgatherqq_avx512vl(*(uint64_t *)((long)local_88 + local_48 * 8));
  auVar8._0_24_ = auVar2._0_24_;
  auVar8._24_8_ = 0;
  auVar2 = vmovdqu64_avx512vl(local_88);
  auVar9._0_24_ = auVar2._0_24_;
  auVar9._24_8_ = 0;
  auVar2 = vpternlogq_avx512vl(auVar9,auVar7,auVar6,0x60);
  auVar5 = vmovdqu64_avx512vl(local_68);
  auVar10._0_24_ = auVar5._0_24_;
  auVar10._24_8_ = 0;
  auVar5 = vpgatherqq_avx512vl(*(uint64_t *)((long)local_68 + local_48 * 8));
  auVar11._0_24_ = auVar5._0_24_;
  auVar11._24_8_ = 0;
  auVar2 = vpternlogq_avx512vl(auVar2,auVar8,auVar6,0x78);
  auVar2 = vpternlogq_avx512vl(auVar2,auVar11,auVar10,0x96);
  local_108 = vmovdqu64_avx512vl(auVar2);
  auVar2 = vmovdqu64_avx512vl(auVar2);
  *(undefined1 (*) [32])view->s[0].w64 = auVar2;
  mpc_and_uint64((uint64_t *)local_68,(uint64_t *)local_a8,(uint64_t *)local_c8,local_48,view,1);
  mpc_and_uint64((uint64_t *)local_128,(uint64_t *)local_88,(uint64_t *)local_c8,
                 (uint64_t *)local_e8,view,2);
  auVar1._8_8_ = 0x3ffffffff;
  auVar1._0_8_ = 0x3ffffffff;
  auVar1 = vpandq_avx512vl(*(undefined1 (*) [16])in,auVar1);
  auVar12 = vpsrlq_avx(local_88._0_16_ ^ local_68._0_16_,2);
  auVar13 = vpsrlq_avx(local_88._0_16_ ^ local_a8._0_16_ ^ local_128._0_16_,1);
  auVar12 = vpternlogq_avx512vl(auVar12 ^ local_108._0_16_,auVar13,local_c8._0_16_,0x96);
  auVar1 = vpternlogq_avx512vl(auVar12,local_88._0_16_ ^ local_a8._0_16_,auVar1,0x96);
  *(undefined1 (*) [16])in = auVar1;
  return;
}

Assistant:

static void mpc_sbox_prove_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_PROOF);

  mpc_and_uint64(r0m, x0s, x1s, r2m, view, 0);
  mpc_and_uint64(r2m, x1s, x2m, r1s, view, 1);
  mpc_and_uint64(r1m, x0s, x2m, r0s, view, 2);

  bitsliced_step_2_uint64_10(SC_PROOF - 1);
}